

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintTwoBodies::SetVariables
          (ChConstraintTwoBodies *this,ChVariables *mvariables_a,ChVariables *mvariables_b)

{
  long lVar1;
  bool bVar2;
  
  if (mvariables_a != (ChVariables *)0x0) {
    lVar1 = __dynamic_cast(mvariables_a,&ChVariables::typeinfo,&ChVariablesBody::typeinfo,0);
    if (lVar1 != 0) {
      if (mvariables_b != (ChVariables *)0x0) {
        lVar1 = __dynamic_cast(mvariables_b,&ChVariables::typeinfo,&ChVariablesBody::typeinfo,0);
        if (lVar1 != 0) {
          (this->super_ChConstraintTwo).super_ChConstraint.valid = true;
          if ((((this->super_ChConstraintTwo).super_ChConstraint.disabled == false) &&
              ((this->super_ChConstraintTwo).super_ChConstraint.redundant == false)) &&
             ((this->super_ChConstraintTwo).super_ChConstraint.broken == false)) {
            bVar2 = (this->super_ChConstraintTwo).super_ChConstraint.mode != CONSTRAINT_FREE;
          }
          else {
            bVar2 = false;
          }
          (this->super_ChConstraintTwo).super_ChConstraint.active = bVar2;
          (this->super_ChConstraintTwo).variables_a = mvariables_a;
          (this->super_ChConstraintTwo).variables_b = mvariables_b;
          return;
        }
      }
      __assert_fail("dynamic_cast<ChVariablesBody*>(mvariables_b)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChConstraintTwoBodies.cpp"
                    ,0x40,
                    "virtual void chrono::ChConstraintTwoBodies::SetVariables(ChVariables *, ChVariables *)"
                   );
    }
  }
  __assert_fail("dynamic_cast<ChVariablesBody*>(mvariables_a)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChConstraintTwoBodies.cpp"
                ,0x3f,
                "virtual void chrono::ChConstraintTwoBodies::SetVariables(ChVariables *, ChVariables *)"
               );
}

Assistant:

void ChConstraintTwoBodies::SetVariables(ChVariables* mvariables_a, ChVariables* mvariables_b) {
    assert(dynamic_cast<ChVariablesBody*>(mvariables_a));
    assert(dynamic_cast<ChVariablesBody*>(mvariables_b));

    if (!mvariables_a || !mvariables_b) {
        SetValid(false);
        return;
    }

    SetValid(true);
    variables_a = mvariables_a;
    variables_b = mvariables_b;
}